

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_>::Data
          (Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *this,
          Data<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_> *other,size_t reserved)

{
  uchar *puVar1;
  byte bVar2;
  ulong uVar3;
  Span *pSVar4;
  Entry *pEVar5;
  uint uVar6;
  Node<unsigned_long_long,_QRenderRule> *pNVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  size_t numBuckets;
  R RVar12;
  Bucket BVar13;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar3 = other->size;
  this->size = uVar3;
  if (reserved < uVar3) {
    reserved = uVar3;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar8 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar8 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar12 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar12.spans;
  uVar3 = other->numBuckets;
  if (0x7f < uVar3) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      pSVar4 = other->spans;
      lVar11 = 0;
      do {
        bVar2 = pSVar4->offsets[lVar11 + lVar8];
        if (bVar2 != 0xff) {
          pEVar5 = pSVar4[uVar10].entries;
          uVar6 = (uint)bVar2 * 0x90;
          puVar1 = (pEVar5->storage).data + uVar6;
          uVar9 = *(ulong *)puVar1 ^ this->seed;
          uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
          uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
          BVar13 = findBucketWithHash<unsigned_long_long>
                             (this,(unsigned_long_long *)((pEVar5->storage).data + uVar6),
                              uVar9 >> 0x20 ^ uVar9);
          pNVar7 = Span<QHashPrivate::Node<unsigned_long_long,_QRenderRule>_>::insert
                             (BVar13.span,BVar13.index);
          pNVar7->key = *(ulong *)puVar1;
          QRenderRule::QRenderRule(&pNVar7->value,(QRenderRule *)(puVar1 + 8));
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x80);
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 0x90;
    } while (uVar10 != uVar3 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }